

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.c
# Opt level: O3

void plygo(runcxdef *run,voccxdef *voc,tiocxdef *tio,objnum preinit,char *restore_fname)

{
  errcxdef *ctx;
  undefined1 *puVar1;
  objnum oVar2;
  int iVar3;
  ushort **ppuVar4;
  long lVar5;
  byte *scrnam;
  byte bVar6;
  char *__src;
  char cVar7;
  int iVar8;
  bool bVar9;
  int inited;
  char buf_1 [128];
  char fname [256];
  char filbuf [128];
  errdef fr_;
  undefined1 auStack_2258 [4];
  int local_2254;
  objnum local_224e;
  int local_224c;
  char *local_2248;
  uint local_223c;
  char local_2238;
  byte local_2237;
  byte local_2236 [126];
  char local_21b8 [256];
  char local_20b8 [128];
  errdef local_2038 [26];
  
  ctx = run->runcxerr;
  local_2254 = 0;
  outformat("\\H+<?T2>\\H-");
  __src = voc->voccxredobuf;
  local_223c = (uint)preinit;
  iVar8 = 1;
  local_224e = preinit;
  local_2248 = __src;
LAB_001fad44:
  if (local_2254 == 0) {
    tiosetactor(voc->voccxtio,voc->voccxme);
    oVar2 = local_224e;
    if (iVar8 == 0) goto LAB_001fae14;
    voc->voccxpreinit = local_224e;
    local_2038[0].errcode = _setjmp((__jmp_buf_tag *)local_2038[0].errbuf);
    if (local_2038[0].errcode == 0) {
      local_2038[0].errprv = ctx->errcxptr;
      ctx->errcxptr = local_2038;
      run->runcxsp = run->runcxstk;
      run->runcxhp = run->runcxheap;
      run->runcxdbg->dbgcxdep = 0;
      run->runcxdbg->dbgcxfcn = 0;
      voc_stk_ini(voc,0x1f400);
      if (oVar2 != 0xffff) {
        runfn(run,(objnum)local_223c,0);
      }
      ctx->errcxptr = local_2038[0].errprv;
      goto LAB_001fae14;
    }
    ctx->errcxptr = local_2038[0].errprv;
    __src = local_2248;
    do {
      if (local_2038[0].errcode != 0x3fa) goto LAB_001fb385;
      if (local_2254 != 0) {
LAB_001fae66:
        iVar8 = 0;
        break;
      }
      tiosetactor(voc->voccxtio,voc->voccxme);
LAB_001fae14:
      __src = local_2248;
      if ((restore_fname != (char *)0x0) && (voc->voccxinitrestore != 0xffff)) goto LAB_001fae66;
      local_2038[0].errcode = _setjmp((__jmp_buf_tag *)local_2038[0].errbuf);
      if (local_2038[0].errcode == 0) goto LAB_001fb2d1;
      ctx->errcxptr = local_2038[0].errprv;
    } while( true );
  }
  goto LAB_001fae69;
LAB_001fb2d1:
  local_2038[0].errprv = ctx->errcxptr;
  ctx->errcxptr = local_2038;
  run->runcxsp = run->runcxstk;
  run->runcxhp = run->runcxheap;
  iVar8 = 0;
  run->runcxdbg->dbgcxdep = 0;
  run->runcxdbg->dbgcxfcn = 0;
  voc_stk_ini(voc,0x1f400);
  runfn(run,voc->voccxini,0);
  ctx->errcxptr = local_2038[0].errprv;
LAB_001fae69:
  local_2254 = 0;
  local_224c = iVar8;
  iVar8 = os_paramfile(local_20b8);
  if (iVar8 != 0) {
    restore_fname = local_20b8;
  }
  if (restore_fname != (char *)0x0) {
    if (voc->voccxinitrestore == 0xffff) {
      os_printz("\n\n[Restoring saved game]\n\n");
      iVar8 = fiorso(voc,restore_fname);
      if (iVar8 != 0) {
        sprintf((char *)local_2038,"\n\nError: unable to restore file \"%s\"\n\n",restore_fname);
        os_printz((char *)local_2038);
      }
    }
    else {
      cVar7 = *restore_fname;
      if (cVar7 == '\0') {
        iVar8 = 0;
      }
      else {
        lVar5 = 0;
        puVar1 = auStack_2258;
        do {
          restore_fname = restore_fname + 1;
          if (cVar7 == '\\') {
            lVar5 = lVar5 + 2;
            puVar1[0x221] = 0x5c;
          }
          else {
            lVar5 = lVar5 + 1;
          }
          puVar1[0x220] = cVar7;
          cVar7 = *restore_fname;
        } while ((cVar7 != '\0') && (puVar1 = auStack_2258 + lVar5, lVar5 < 0x1ffe));
        iVar8 = (int)lVar5;
      }
      run->runcxsp = run->runcxstk;
      run->runcxhp = run->runcxheap;
      run->runcxdbg->dbgcxdep = 0;
      run->runcxdbg->dbgcxfcn = 0;
      voc_stk_ini(voc,0x1f400);
      runpstr(run,(char *)local_2038,iVar8,0);
      runfn(run,voc->voccxinitrestore,1);
    }
  }
  *__src = '\0';
  do {
    iVar8 = _setjmp((__jmp_buf_tag *)local_2038[0].errbuf);
    local_2038[0].errcode = iVar8;
    if (iVar8 == 0) {
      local_2038[0].errprv = ctx->errcxptr;
      ctx->errcxptr = local_2038;
      if (voc->voccxredo == 0) {
        outshow();
        outflush();
        run->runcxsp = run->runcxstk;
        run->runcxhp = run->runcxheap;
        run->runcxdbg->dbgcxdep = 0;
        run->runcxdbg->dbgcxfcn = 0;
        vocread(voc,0xffff,0xffff,&local_2238,0x80,0);
        if (local_2238 != '@') {
          if (voc->voccxredo != 0) goto LAB_001fb093;
          goto LAB_001fb0aa;
        }
        if (local_2237 == 0x21) {
          iVar8 = 1;
LAB_001fb1ca:
          scrnam = local_2236;
          bVar6 = local_2236[0];
        }
        else {
          if (local_2237 == 0x40) {
            iVar8 = 0;
            setmore(0);
            os_nonstop_mode(1);
            goto LAB_001fb1ca;
          }
          iVar8 = 0;
          scrnam = &local_2237;
          bVar6 = local_2237;
        }
        if ('\0' < (char)bVar6) {
          ppuVar4 = __ctype_b_loc();
          do {
            if ((*(byte *)((long)*ppuVar4 + (ulong)bVar6 * 2 + 1) & 0x20) == 0) goto LAB_001fb268;
            bVar6 = scrnam[1];
            scrnam = scrnam + 1;
          } while ('\0' < (char)bVar6);
        }
        if (bVar6 == 0) {
          iVar3 = tio_askfile("Read script file:",local_21b8,0x100,1,5);
          __src = local_2248;
          if (iVar3 == 0) {
            qasopn(local_21b8,iVar8);
          }
        }
        else {
LAB_001fb268:
          qasopn((char *)scrnam,iVar8);
          __src = local_2248;
        }
      }
      else {
LAB_001fb093:
        if (*__src != '\0') {
          strcpy(&local_2238,__src);
          *__src = '\0';
        }
LAB_001fb0aa:
        voc->voccxredo = 0;
        os_break();
        voccmd(voc,&local_2238,0x80);
      }
      ctx->errcxptr = local_2038[0].errprv;
LAB_001fb0d7:
      bVar9 = false;
    }
    else {
      ctx->errcxptr = local_2038[0].errprv;
      if (iVar8 - 0x3fbU < 0xfffffffe) {
        if ((iVar8 == 0x3f6) && (voc->voccxredo != 0)) goto LAB_001fb0d7;
        (*ctx->errcxlog)(ctx->errcxlgc,local_2038[0].errfac,iVar8,local_2038[0].erraac,
                         local_2038[0].erraav);
        bVar9 = false;
        if ((iVar8 == 0x3de) && (voc->voccxundo != (objucxdef *)0x0)) {
          local_2038[0].errcode = _setjmp((__jmp_buf_tag *)local_2038[0].errbuf);
          bVar9 = false;
          if (local_2038[0].errcode == 0) {
            local_2038[0].errprv = ctx->errcxptr;
            ctx->errcxptr = local_2038;
            objundo(voc->voccxmem,voc->voccxundo);
            ctx->errcxptr = local_2038[0].errprv;
          }
          else {
            ctx->errcxptr = local_2038[0].errprv;
            if (local_2038[0].errcode - 0xcbU < 0xfffffffe) goto LAB_001fb385;
          }
        }
      }
      else {
        bVar9 = iVar8 == 0x3fa;
        if (iVar8 == 0x3f9) {
          local_2038[0].errcode = _setjmp((__jmp_buf_tag *)local_2038[0].errbuf);
          if (local_2038[0].errcode == 0) {
            local_2038[0].errprv = ctx->errcxptr;
            ctx->errcxptr = local_2038;
            run->runcxdbg->dbgcxfcn = 0;
            run->runcxdbg->dbgcxdep = 0;
            dbguquitting(run->runcxdbg);
            ctx->errcxptr = local_2038[0].errprv;
          }
          else {
            ctx->errcxptr = local_2038[0].errprv;
            if (local_2038[0].errcode == 0x3fa) break;
            if (local_2038[0].errcode != 0x3f9) {
LAB_001fb385:
              errrse1(ctx,local_2038);
            }
          }
          return;
        }
      }
    }
  } while (!bVar9);
  restore_fname = (char *)0x0;
  iVar8 = local_224c;
  goto LAB_001fad44;
}

Assistant:

void plygo(runcxdef *run, voccxdef *voc, tiocxdef *tio, objnum preinit,
           char *restore_fname)
{
    int       err;
    errcxdef *ec = run->runcxerr;
    char      filbuf[128];
    int       first_time;
    int noreg inited = FALSE;

    NOREG((&inited));

    first_time = TRUE;

    /* 
     *   Write out the special <?T2> HTML sequence, in case we're on an HTML
     *   system.  This tells the HTML parser to use the parsing rules for
     *   TADS 2 callers. 
     */
    outformat("\\H+<?T2>\\H-");
    
startover:
    if (!inited)
    {
        /* use Me as the format-string actor for preinit and init */
        tiosetactor(voc->voccxtio, voc->voccxme);

        /*
         *   Run preinit, if it hasn't been run yet.  Note that we only
         *   do this the first time through.  If we come back here via the
         *   restart function, preinit will already have been run in the
         *   restart function itself, so we don't need to run it again.
         */
        if (first_time)
        {
            /* make a note that we've been through here once already */
            first_time = FALSE;

            /* remember the preinit function for later use in restarting */
            voc->voccxpreinit = preinit;

            /* run the preinit() function */
            ERRBEGIN(ec)
            {
                /* reset the interpreter */
                runrst(run);

                /* reset the parser */
                voc_stk_ini(voc, (uint)VOC_STACK_SIZE);

                /* run preinit */
                if (preinit != MCMONINV)
                    runfn(run, preinit, 0);
            }
            ERRCATCH(ec, err)
            {
                /* if they restarted, go back and start over */
                if (err == ERR_RUNRESTART)
                    goto startover;

                /* resignal the error */
                errrse(ec);
            }
            ERREND(ec);
        }
        
        /* 
         *   Run the "init" function.  Do NOT run init if we're restoring
         *   a game directly from the command line AND there's an
         *   initRestore function defined. 
         */
        if (restore_fname == 0 || voc->voccxinitrestore == MCMONINV)
        {
            ERRBEGIN(ec)
            {
                /* reset the interpreter */
                runrst(run);

                /* reset the parser */
                voc_stk_ini(voc, (uint)VOC_STACK_SIZE);

                /* run init */
                runfn(run, (objnum)voc->voccxini, 0);
            }
            ERRCATCH(ec, err)
            {
                /* if they restarted, go back and start over */
                if (err == ERR_RUNRESTART)
                    goto startover;
                
                /* resignal the error */
                errrse(ec);
            }
            ERREND(ec);
        }
    }
    
    /* next time through, we'll need to run init again */
    inited = FALSE;

    /* 
     *   check for startup parameter file to restore - if there's a
     *   system-specific parameter file specified, pretend that it was
     *   specified as the restore file 
     */
    if (os_paramfile(filbuf))
        restore_fname = filbuf;

    /* check for a file to restore */
    if (restore_fname != 0)
    {
        /*
         *   Check to see if the game file supports the initRestore
         *   function.  If so, call it to restore the game.  If not,
         *   restore the game directly. 
         */
        if (voc->voccxinitrestore != MCMONINV)
        {
            char restore_buf[OSFNMAX*2];
            char *src;
            char *dst;
            
            /* convert any backslashes to double backslashes */
            for (src = restore_fname, dst = restore_buf ;
                 *src != '\0' && dst + 2 < restore_buf + sizeof(restore_buf) ;
                 ++src)
            {
                switch(*src)
                {
                case '\\':
                    /* it's a backslash - double it */
                    *dst++ = '\\';
                    *dst++ = '\\';
                    break;

                default:
                    /* copy the character as-is */
                    *dst++ = *src;
                }
            }
            
            /* 
             *   all the game's initRestore function with the name of
             *   saved game file to restore as the argument 
             */

            /* reset the interpreter */
            runrst(run);

            /* reset the parser */
            voc_stk_ini(voc, (uint)VOC_STACK_SIZE);

            /* push the game file name and run initRestore */
            runpstr(run, restore_buf, dst - restore_buf, 0);
            runfn(run, (objnum)voc->voccxinitrestore, 1);
        }
        else
        {
            /* restore the game */
            os_printz("\n\n[Restoring saved game]\n\n");
            err = fiorso(voc, restore_fname);
            if (err)
            {
                char buf[60 + OSFNMAX];

                sprintf(buf, "\n\nError: unable to restore file \"%s\"\n\n",
                        restore_fname);
                os_printz(buf);
            }
        }

        /* forget the saved game name, in case we restore */
        restore_fname = 0;
    }

    /* clear out the redo command buffer */
    voc->voccxredobuf[0] = '\0';
    
    /* read and execute commands */
    for (;;)
    {
        char buf[128];
        
        err = 0;
        ERRBEGIN(ec)
            
        /* read a new command if there's nothing to redo */
        if (!voc->voccxredo)
        {
            /* reset hidden output so we're showing output */
            tioshow(tio);
            tioflush(tio);

            /* clear the interpreter stack */
            runrst(run);

            /* read a command */
            vocread(voc, MCMONINV, MCMONINV, buf, (int)sizeof(buf), 0);

            /* special qa checking */
            if (buf[0] == '@')
            {
                int   quiet = FALSE;
                char *p;
                
                p = buf + 1;
                if (*p == '@')
                {
                    /* turn off MORE mode */
                    setmore(0);

                    /* set NONSTOP mode in the OS layer */
                    os_nonstop_mode(TRUE);

                    /* skip the extra '@' */
                    ++p;
                }
                else if (*p == '!')
                {
                    quiet = TRUE;
                    ++p;
                }
                while (*p != '\0' && t_isspace(*p)) ++p;
                if (*p != '\0')
                {
                    /* open the named file */
                    qasopn(p, quiet);
                }
                else
                {
                    char fname[256];

                    /* no file was named - ask the user to select a file */
                    if (tio_askfile("Read script file:", fname, sizeof(fname),
                                    OS_AFP_OPEN, OSFTCMD) == 0)
                        qasopn(fname, quiet);
                }
                goto end_loop;
            }
        }

        /* 
         *   If there's redo in the redo buffer, use it now.  If the
         *   buffer is empty and the redo flag is set, we'll just
         *   re-execute whatever's in our internal buffer.
         */
        if (voc->voccxredo && voc->voccxredobuf[0] != '\0')
        {
            /* copy the redo buffer into our internal buffer */
            strcpy(buf, voc->voccxredobuf);

            /* we've consumed it now, so clear it out */
            voc->voccxredobuf[0] = '\0';
        }

        /* we've now consumed the redo */
        voc->voccxredo = FALSE;

        /* clear any pending break that's queued up */
        (void)os_break();

        /* execute the command */
        (void)voccmd(voc, buf, (uint)sizeof(buf));
        
    end_loop:
        ERRCATCH(ec, err)
        {
            if (err != ERR_RUNQUIT
                && err != ERR_RUNRESTART
                && !(err == ERR_RUNABRT && voc->voccxredo))
                errclog(ec);
        }
        ERREND(ec);

        /* on interrupt, undo last command (which was partially executed) */
        if (err == ERR_USRINT && voc->voccxundo)
        {
            ERRBEGIN(ec)
                objundo(voc->voccxmem, voc->voccxundo);
            ERRCATCH(ec, err)
                if (err != ERR_NOUNDO && err != ERR_ICUNDO)
                    errrse(ec);
            ERREND(ec)
        }
            
        /* if they want to quit, we're done */
        if (err == ERR_RUNQUIT)
            break;
        else if (err == ERR_RUNRESTART)
            goto startover;
    }

    /*
     *   If we're quitting, give the debugger one last chance at taking
     *   control.  If it just returns, we can go ahead and terminate, but
     *   if it wants it can restart the game by calling bifrst() as
     *   normal.  
     */
    ERRBEGIN(ec)
    {
        /* clear anything in the debugger stack trace */
        run->runcxdbg->dbgcxfcn = 0;
        run->runcxdbg->dbgcxdep = 0;

        /* tell the debugger the game has exited */
        dbguquitting(run->runcxdbg);
    }
    ERRCATCH(ec, err)
    {
        switch(err)
        {
        case ERR_RUNRESTART:
            /* they restarted the game - re-enter the play loop */
            goto startover;

        case ERR_RUNQUIT:
            /* quitting - proceed to return as normal */
            break;

        default:
            /* resignal any other error */
            errrse(ec);
        }
    }
    ERREND(ec);
}